

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dymon_net_linux.cpp
# Opt level: O0

int __thiscall DymonNet::connect(DymonNet *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  char *__cp;
  uint uVar1;
  uint uVar2;
  cJSON *item;
  undefined4 in_register_00000034;
  fd_set *__arr;
  undefined1 local_100 [4];
  uint __i;
  fd_set writeSet;
  timeval connectTimeout;
  timeval recvTimeout;
  timeval sendTimeout;
  uint32_t addr;
  sockaddr_in address;
  int flags;
  int sock;
  uint16_t port;
  char *printerIp;
  cJSON *ip;
  void *arg_local;
  DymonNet *this_local;
  
  if ((cJSON *)CONCAT44(in_register_00000034,__fd) == (cJSON *)0x0) {
    this_local._7_1_ = 0;
  }
  else {
    item = cJSON_GetObjectItemCaseSensitive((cJSON *)CONCAT44(in_register_00000034,__fd),"ip");
    uVar1 = cJSON_IsString(item);
    if (uVar1 == 0) {
      this_local._7_1_ = 0;
      this = (DymonNet *)(ulong)uVar1;
    }
    else {
      __cp = item->valuestring;
      uVar1 = socket(2,1,6);
      if ((int)uVar1 < 0) {
        this_local._7_1_ = 0;
        this = (DymonNet *)(ulong)uVar1;
      }
      else {
        uVar2 = fcntl(uVar1,3,0);
        fcntl(uVar1,4,(ulong)(uVar2 | 0x800));
        sendTimeout.tv_usec._0_4_ = inet_addr(__cp);
        sendTimeout.tv_usec._6_2_ = htons(0x238c);
        sendTimeout.tv_usec._4_2_ = 2;
        ::connect(uVar1,(sockaddr *)((long)&sendTimeout.tv_usec + 4),0x10);
        fcntl(uVar1,4,(ulong)uVar2);
        memset(&recvTimeout.tv_usec,0,0x10);
        memset(&connectTimeout.tv_usec,0,0x10);
        recvTimeout.tv_usec = 5;
        connectTimeout.tv_usec = 5;
        setsockopt(uVar1,1,0x15,&recvTimeout.tv_usec,0x10);
        setsockopt(uVar1,1,0x14,&connectTimeout.tv_usec,0x10);
        memset(writeSet.fds_bits + 0xf,0,0x10);
        writeSet.fds_bits[0xf] = 5;
        for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
          writeSet.fds_bits[(ulong)__arr._4_4_ - 1] = 0;
        }
        writeSet.fds_bits[(long)((int)uVar1 / 0x40) + -1] =
             1L << ((byte)((long)(int)uVar1 % 0x40) & 0x3f) |
             writeSet.fds_bits[(long)((int)uVar1 / 0x40) + -1];
        select(uVar1 + 1,(fd_set *)0x0,(fd_set *)local_100,(fd_set *)0x0,
               (timeval *)(writeSet.fds_bits + 0xf));
        if ((writeSet.fds_bits[(long)((int)uVar1 / 0x40) + -1] &
            1L << ((byte)((long)(int)uVar1 % 0x40) & 0x3f)) == 0) {
          uVar1 = ::close(uVar1);
          this = (DymonNet *)(ulong)uVar1;
          this_local._7_1_ = 0;
        }
        else {
          *(uint *)&(this->super_Dymon).field_0x34 = uVar1;
          this_local._7_1_ = 1;
        }
      }
    }
  }
  return (int)CONCAT71((int7)((ulong)this >> 8),this_local._7_1_);
}

Assistant:

bool DymonNet::connect(void * arg)
{
   if (arg == nullptr)
   {
      return false;
   }
   cJSON * ip = cJSON_GetObjectItemCaseSensitive((cJSON *)arg, "ip"); //get IP
   if (!cJSON_IsString(ip))
   {
      return false;
   }
   const char * printerIp = ip->valuestring;
   constexpr uint16_t port = 9100;

   //try to create socket
   int sock = socket(AF_INET, SOCK_STREAM, IPPROTO_TCP);
   if (sock < 0)
   {
      return false;
   }

   //on success
   //set the socket to non-blocking
   int flags = fcntl(sock, F_GETFL, 0);
   fcntl(sock, F_SETFL, flags | O_NONBLOCK);

   //start connecting to host
   struct sockaddr_in address;  /* the libc network address data structure */
   uint32_t addr = inet_addr(printerIp); //convert string representation of IP address (decimals and dots) to binary
   address.sin_addr.s_addr = addr; /* assign the address */
   address.sin_port = htons(port);            /* translate int2port num */
   address.sin_family = AF_INET;
   ::connect(sock, (struct sockaddr *)&address, sizeof(address));

   //go back to blocking mode
   fcntl(sock, F_SETFL, flags);
   //configure send and receive timeouts
   struct timeval sendTimeout = { 0 };
   struct timeval recvTimeout = { 0 };
   sendTimeout.tv_sec = _SEND_RECV_TIMEOUT_1S;
   recvTimeout.tv_sec = _SEND_RECV_TIMEOUT_1S;
   setsockopt(sock, SOL_SOCKET, SO_SNDTIMEO, (char *)&sendTimeout, sizeof(struct timeval));
   setsockopt(sock, SOL_SOCKET, SO_RCVTIMEO, (char *)&recvTimeout, sizeof(struct timeval));

   //wait for connection, with timeout of 2 seconds
   struct timeval connectTimeout = { 0 };
   connectTimeout.tv_sec = _CONNECT_TIMEOUT_1SEC;
   fd_set writeSet;
   FD_ZERO(&writeSet);
   FD_SET(sock, &writeSet);

   // check if the socket is ready
   select(sock + 1, nullptr, &writeSet, nullptr, &connectTimeout);
   if (FD_ISSET(sock, &writeSet))
   {
      this->sockfd = (int)sock;
      return true;
   }

   //close socket in case of timeout
   ::close(sock);
   return false;

}